

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O0

int ASN1_BIT_STRING_get_bit(ASN1_BIT_STRING *a,int n)

{
  int v;
  int w;
  int n_local;
  ASN1_BIT_STRING *a_local;
  
  if (((a == (ASN1_BIT_STRING *)0x0) || (a->length < n / 8 + 1)) || (a->data == (uchar *)0x0)) {
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = (uint)(((uint)a->data[n / 8] & 1 << (7 - ((byte)n & 7) & 0x1f)) != 0);
  }
  return a_local._4_4_;
}

Assistant:

int ASN1_BIT_STRING_get_bit(const ASN1_BIT_STRING *a, int n) {
  int w, v;

  w = n / 8;
  v = 1 << (7 - (n & 0x07));
  if ((a == NULL) || (a->length < (w + 1)) || (a->data == NULL)) {
    return 0;
  }
  return ((a->data[w] & v) != 0);
}